

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O2

int32_t __thiscall
icu_63::Edits::Iterator::findIndex(Iterator *this,int32_t i,UBool findSource,UErrorCode *errorCode)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint uVar7;
  UBool UVar8;
  int iVar9;
  int iVar10;
  int32_t iVar11;
  int32_t *piVar12;
  int iVar13;
  ulong uVar14;
  
  iVar11 = -1;
  if ((-1 < i) && (*errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    uVar14 = (ulong)(findSource == '\0');
    piVar12 = &this->newLength_;
    if (findSource != '\0') {
      piVar12 = &this->oldLength_;
    }
    uVar7 = (&this->srcIndex)[uVar14 * 2];
    if (i < (int)uVar7) {
      if (uVar7 >> 1 <= (uint)i) {
        while( true ) {
          do {
            previous(this,errorCode);
            iVar10 = (&this->srcIndex)[uVar14 * 2];
            if (iVar10 <= i) {
              return 0;
            }
            iVar9 = this->remaining;
          } while (iVar9 < 1);
          iVar13 = ((this->array[this->index] & 0x1ff) - iVar9) + 1;
          if (iVar10 - iVar13 * (&this->oldLength_)[uVar14] <= i) break;
          this->srcIndex = this->srcIndex - this->oldLength_ * iVar13;
          iVar13 = iVar13 * this->newLength_;
          uVar1 = this->replIndex;
          uVar4 = this->destIndex;
          this->replIndex = uVar1 - iVar13;
          this->destIndex = uVar4 - iVar13;
          this->remaining = 0;
        }
        iVar10 = (iVar10 + ~i) / (&this->oldLength_)[uVar14];
        iVar13 = iVar10 + 1;
        this->srcIndex = this->srcIndex - this->oldLength_ * iVar13;
        iVar13 = iVar13 * this->newLength_;
        uVar3 = this->replIndex;
        uVar6 = this->destIndex;
        this->replIndex = uVar3 - iVar13;
        this->destIndex = uVar6 - iVar13;
        this->remaining = iVar10 + iVar9 + 1;
        return 0;
      }
      this->dir = '\0';
      this->remaining = 0;
      this->index = 0;
      this->oldLength_ = 0;
      this->newLength_ = 0;
      this->srcIndex = 0;
      this->replIndex = 0;
      this->destIndex = 0;
    }
    else if (i < (int)(uVar7 + *piVar12)) {
      return 0;
    }
    while (UVar8 = next(this,'\0',errorCode), UVar8 != '\0') {
      iVar10 = (&this->srcIndex)[uVar14 * 2];
      iVar9 = (&this->oldLength_)[uVar14];
      if (i < iVar9 + iVar10) {
        return 0;
      }
      iVar13 = this->remaining;
      if (1 < iVar13) {
        if (i < iVar13 * iVar9 + iVar10) {
          iVar9 = (i - iVar10) / iVar9;
          this->srcIndex = this->srcIndex + this->oldLength_ * iVar9;
          iVar10 = iVar9 * this->newLength_;
          uVar2 = this->replIndex;
          uVar5 = this->destIndex;
          this->replIndex = iVar10 + uVar2;
          this->destIndex = iVar10 + uVar5;
          this->remaining = iVar13 - iVar9;
          return 0;
        }
        this->oldLength_ = this->oldLength_ * iVar13;
        this->newLength_ = iVar13 * this->newLength_;
        this->remaining = 0;
      }
    }
    iVar11 = 1;
  }
  return iVar11;
}

Assistant:

int32_t Edits::Iterator::findIndex(int32_t i, UBool findSource, UErrorCode &errorCode) {
    if (U_FAILURE(errorCode) || i < 0) { return -1; }
    int32_t spanStart, spanLength;
    if (findSource) {  // find source index
        spanStart = srcIndex;
        spanLength = oldLength_;
    } else {  // find destination index
        spanStart = destIndex;
        spanLength = newLength_;
    }
    if (i < spanStart) {
        if (i >= (spanStart / 2)) {
            // Search backwards.
            for (;;) {
                UBool hasPrevious = previous(errorCode);
                U_ASSERT(hasPrevious);  // because i>=0 and the first span starts at 0
                (void)hasPrevious;  // avoid unused-variable warning
                spanStart = findSource ? srcIndex : destIndex;
                if (i >= spanStart) {
                    // The index is in the current span.
                    return 0;
                }
                if (remaining > 0) {
                    // Is the index in one of the remaining compressed edits?
                    // spanStart is the start of the current span, first of the remaining ones.
                    spanLength = findSource ? oldLength_ : newLength_;
                    int32_t u = array[index];
                    U_ASSERT(MAX_UNCHANGED < u && u <= MAX_SHORT_CHANGE);
                    int32_t num = (u & SHORT_CHANGE_NUM_MASK) + 1 - remaining;
                    int32_t len = num * spanLength;
                    if (i >= (spanStart - len)) {
                        int32_t n = ((spanStart - i - 1) / spanLength) + 1;
                        // 1 <= n <= num
                        srcIndex -= n * oldLength_;
                        replIndex -= n * newLength_;
                        destIndex -= n * newLength_;
                        remaining += n;
                        return 0;
                    }
                    // Skip all of these edits at once.
                    srcIndex -= num * oldLength_;
                    replIndex -= num * newLength_;
                    destIndex -= num * newLength_;
                    remaining = 0;
                }
            }
        }
        // Reset the iterator to the start.
        dir = 0;
        index = remaining = oldLength_ = newLength_ = srcIndex = replIndex = destIndex = 0;
    } else if (i < (spanStart + spanLength)) {
        // The index is in the current span.
        return 0;
    }
    while (next(FALSE, errorCode)) {
        if (findSource) {
            spanStart = srcIndex;
            spanLength = oldLength_;
        } else {
            spanStart = destIndex;
            spanLength = newLength_;
        }
        if (i < (spanStart + spanLength)) {
            // The index is in the current span.
            return 0;
        }
        if (remaining > 1) {
            // Is the index in one of the remaining compressed edits?
            // spanStart is the start of the current span, first of the remaining ones.
            int32_t len = remaining * spanLength;
            if (i < (spanStart + len)) {
                int32_t n = (i - spanStart) / spanLength;  // 1 <= n <= remaining - 1
                srcIndex += n * oldLength_;
                replIndex += n * newLength_;
                destIndex += n * newLength_;
                remaining -= n;
                return 0;
            }
            // Make next() skip all of these edits at once.
            oldLength_ *= remaining;
            newLength_ *= remaining;
            remaining = 0;
        }
    }
    return 1;
}